

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# osdtext.cpp
# Opt level: O2

void __thiscall CMU462::OSDText::render(OSDText *this)

{
  pointer pOVar1;
  undefined1 local_70 [72];
  
  (*__glewUseProgram)(this->program);
  glEnable(0xbe2);
  glBlendFunc(0x302,0x303);
  for (pOVar1 = (this->lines).super__Vector_base<CMU462::OSDLine,_std::allocator<CMU462::OSDLine>_>.
                _M_impl.super__Vector_impl_data._M_start;
      pOVar1 != (this->lines).super__Vector_base<CMU462::OSDLine,_std::allocator<CMU462::OSDLine>_>.
                _M_impl.super__Vector_impl_data._M_finish; pOVar1 = pOVar1 + 1) {
    OSDLine::OSDLine((OSDLine *)local_70,pOVar1);
    draw_line(this,(OSDLine *)local_70);
    std::__cxx11::string::~string((string *)(local_70 + 0x10));
  }
  (*__glewUseProgram)(0);
  return;
}

Assistant:

void OSDText::render() {

  glUseProgram(program);

  glEnable( GL_BLEND );
  glBlendFunc( GL_SRC_ALPHA, GL_ONE_MINUS_SRC_ALPHA );

  vector<OSDLine>::iterator it = lines.begin();
  while(it != lines.end()) {
    draw_line(*it);
    ++it;
  }

  glUseProgram(0);
}